

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::at
          (span<int,_18446744073709551615UL> *this,size_type idx)

{
  if (this->size_ <= idx) {
    detail::throw_out_of_range(idx,this->size_);
  }
  return this->data_ + idx;
}

Assistant:

span_constexpr14 reference at( size_type idx ) const
    {
#if span_CONFIG( NO_EXCEPTIONS )
        return this->operator[]( idx );
#else
        if ( !detail::is_positive( idx ) || size() <= idx )
        {
            detail::throw_out_of_range( idx, size() );
        }
        return *( data() + idx );
#endif
    }